

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

void __thiscall crnlib::dxt5_block::flip_x(dxt5_block *this,uint w,uint h)

{
  uint val;
  uint val_00;
  undefined4 local_20;
  uint c;
  uint y;
  uint x;
  uint h_local;
  uint w_local;
  dxt5_block *this_local;
  
  for (c = 0; c < w >> 1; c = c + 1) {
    for (local_20 = 0; local_20 < h; local_20 = local_20 + 1) {
      val = get_selector(this,c,local_20);
      val_00 = get_selector(this,(w - 1) - c,local_20);
      set_selector(this,c,local_20,val_00);
      set_selector(this,(w - 1) - c,local_20,val);
    }
  }
  return;
}

Assistant:

inline void flip_x(uint w = 4, uint h = 4)
        {
            for (uint x = 0; x < (w / 2); x++)
            {
                for (uint y = 0; y < h; y++)
                {
                    const uint c = get_selector(x, y);
                    set_selector(x, y, get_selector((w - 1) - x, y));
                    set_selector((w - 1) - x, y, c);
                }
            }
        }